

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

buffer_appender<char>
fmt::v7::detail::write_nonfinite<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,bool isinf,basic_format_specs<char> *specs,float_specs *fspecs)

{
  buffer_appender<char> bVar1;
  char *local_80;
  char *local_78;
  char *local_70;
  anon_class_16_2_632e021f local_68;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_58;
  size_t local_50;
  size_t size;
  undefined8 uStack_40;
  sign_t sign;
  size_t str_size;
  char *str;
  float_specs *fspecs_local;
  basic_format_specs<char> *specs_local;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bStack_18;
  bool isinf_local;
  buffer_appender<char> out_local;
  
  if (isinf) {
    if ((*(uint *)&fspecs->field_0x4 >> 0x10 & 1) == 0) {
      local_70 = "inf";
    }
    else {
      local_70 = "INF";
    }
    local_78 = local_70;
  }
  else {
    if ((*(uint *)&fspecs->field_0x4 >> 0x10 & 1) == 0) {
      local_80 = "nan";
    }
    else {
      local_80 = "NAN";
    }
    local_78 = local_80;
  }
  str_size = (size_t)local_78;
  uStack_40 = 3;
  local_68.sign = *(uint *)&fspecs->field_0x4 >> 8 & 0xff;
  local_50 = (long)(int)(uint)(local_68.sign != none) + 3;
  local_68.str = local_78;
  local_58 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  size._4_4_ = local_68.sign;
  str = (char *)fspecs;
  fspecs_local = (float_specs *)specs;
  specs_local._7_1_ = isinf;
  bStack_18 = out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  bVar1 = write_padded<(fmt::v7::align::type)1,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_nonfinite<char,fmt::v7::detail::buffer_appender<char>>(fmt::v7::detail::buffer_appender<char>,bool,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs_const&)::_lambda(fmt::v7::detail::buffer_appender<char>)_1_>
                    (out,specs,local_50,&local_68);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}